

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_resize.cpp
# Opt level: O3

void ncnn::resize_bilinear_c3
               (uchar *src,int srcw,int srch,int srcstride,uchar *dst,int w,int h,int stride)

{
  long lVar1;
  short sVar2;
  long lVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  int *piVar8;
  void *pvVar9;
  long lVar10;
  long lVar11;
  void *pvVar12;
  long lVar13;
  void *pvVar14;
  void *pvVar15;
  int *piVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  size_t totalsize;
  int *piVar22;
  bool bVar23;
  uint uVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  void *ptr;
  void *local_b8;
  void *local_88;
  int *local_58;
  void *local_38;
  
  uVar24 = (h + w) * 2;
  uVar20 = 0xffffffffffffffff;
  if (-1 < (int)uVar24) {
    uVar20 = (ulong)uVar24 * 4;
  }
  piVar7 = (int *)operator_new__(uVar20);
  lVar10 = (long)w;
  lVar11 = (long)h;
  if (0 < w) {
    uVar20 = 0;
    do {
      fVar4 = ((float)(int)uVar20 + 0.5) * (float)srcw * (1.0 / (float)w) + -0.5;
      fVar25 = floorf(fVar4);
      iVar5 = (int)fVar25;
      fVar28 = 0.0;
      iVar6 = iVar5;
      if (iVar5 < 1) {
        iVar6 = 0;
      }
      if (-1 < iVar5) {
        fVar28 = (fVar4 - (float)(int)fVar25) * 2048.0;
      }
      iVar5 = iVar6;
      if (srcw + -1 <= iVar6) {
        iVar5 = srcw + -2;
      }
      piVar7[uVar20] = iVar5 * 3;
      if (srcw + -1 <= iVar6) {
        fVar28 = 2048.0;
      }
      uVar24 = -(uint)(0.0 <= 2048.0 - fVar28);
      auVar26._0_4_ = (int)((float)(uVar24 & 0x3f000000 | ~uVar24 & 0xbf000000) + (2048.0 - fVar28))
      ;
      auVar26._4_4_ =
           (int)((float)(-(uint)(0.0 <= fVar28) & 0x3f000000 | ~-(uint)(0.0 <= fVar28) & 0xbf000000)
                + fVar28);
      auVar26._8_8_ = 0;
      auVar26 = packssdw(auVar26,auVar26);
      piVar7[lVar10 + lVar11 + uVar20] = auVar26._0_4_;
      uVar20 = uVar20 + 1;
    } while ((uint)w != uVar20);
  }
  piVar22 = piVar7 + lVar11 + lVar10 * 2;
  if (0 < h) {
    uVar20 = 0;
    do {
      fVar4 = ((float)(int)uVar20 + 0.5) * (float)srch * (1.0 / (float)h) + -0.5;
      fVar25 = floorf(fVar4);
      iVar6 = (int)fVar25;
      fVar28 = 0.0;
      bVar23 = -1 < iVar6;
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      if (bVar23) {
        fVar28 = (fVar4 - (float)(int)fVar25) * 2048.0;
      }
      iVar5 = iVar6;
      if (srch + -1 <= iVar6) {
        iVar5 = srch + -2;
      }
      piVar7[lVar10 + uVar20] = iVar5;
      if (srch + -1 <= iVar6) {
        fVar28 = 2048.0;
      }
      uVar24 = -(uint)(0.0 <= 2048.0 - fVar28);
      auVar27._0_4_ = (int)((float)(uVar24 & 0x3f000000 | ~uVar24 & 0xbf000000) + (2048.0 - fVar28))
      ;
      auVar27._4_4_ =
           (int)((float)(-(uint)(0.0 <= fVar28) & 0x3f000000 | ~-(uint)(0.0 <= fVar28) & 0xbf000000)
                + fVar28);
      auVar27._8_8_ = 0;
      auVar26 = packssdw(auVar27,auVar27);
      piVar22[uVar20] = auVar26._0_4_;
      uVar20 = uVar20 + 1;
    } while ((uint)h != uVar20);
  }
  iVar6 = w * 3 + 1;
  if (iVar6 == 0) {
    local_58 = (int *)0x0;
    local_b8 = (void *)0x0;
    piVar8 = (int *)0x0;
    local_88 = (void *)0x0;
  }
  else {
    uVar20 = (long)iVar6 * 2 + 3U & 0xfffffffffffffffc;
    local_38 = (void *)0x0;
    iVar6 = posix_memalign(&local_38,0x10,uVar20 + 4);
    local_b8 = local_38;
    pvVar12 = (void *)0x0;
    if (iVar6 == 0) {
      pvVar12 = local_38;
    }
    *(undefined4 *)((long)pvVar12 + uVar20) = 1;
    local_58 = (int *)((long)pvVar12 + uVar20);
    local_38 = (void *)0x0;
    iVar6 = posix_memalign(&local_38,0x10,uVar20 + 4);
    local_88 = local_38;
    pvVar12 = (void *)0x0;
    if (iVar6 == 0) {
      pvVar12 = local_38;
    }
    piVar8 = (int *)((long)pvVar12 + uVar20);
    *(undefined4 *)((long)pvVar12 + uVar20) = 1;
  }
  if (0 < h) {
    lVar3 = (ulong)(uint)w * 6;
    lVar1 = lVar11 * 4 + lVar10 * 4;
    uVar20 = 0;
    pvVar12 = local_b8;
    pvVar15 = local_88;
    iVar6 = -2;
    do {
      iVar5 = piVar7[lVar10 + uVar20];
      pvVar9 = pvVar15;
      pvVar14 = pvVar12;
      if (iVar5 != iVar6) {
        if (iVar5 == iVar6 + 1) {
          pvVar9 = pvVar12;
          pvVar14 = pvVar15;
          if (0 < w) {
            iVar6 = (iVar5 + 1) * srcstride;
            lVar17 = 0;
            piVar16 = piVar7;
            do {
              lVar13 = (long)*piVar16;
              iVar21 = (int)(short)piVar16[lVar10 + lVar11];
              iVar18 = (int)*(short *)((long)piVar16 + lVar1 + 2);
              *(short *)((long)pvVar12 + lVar17) =
                   (short)((uint)src[lVar13 + (long)iVar6 + 3] * iVar18 +
                           (uint)src[lVar13 + iVar6] * iVar21 >> 4);
              *(short *)((long)pvVar12 + lVar17 + 2) =
                   (short)((uint)src[lVar13 + (long)iVar6 + 4] * iVar18 +
                           (uint)src[lVar13 + (long)iVar6 + 1] * iVar21 >> 4);
              *(short *)((long)pvVar12 + lVar17 + 4) =
                   (short)((uint)src[lVar13 + (long)iVar6 + 5] * iVar18 +
                           (uint)src[lVar13 + (long)iVar6 + 2] * iVar21 >> 4);
              piVar16 = piVar16 + 1;
              lVar17 = lVar17 + 6;
            } while (lVar3 != lVar17);
          }
        }
        else if (0 < w) {
          iVar6 = iVar5 * srcstride;
          iVar18 = (iVar5 + 1) * srcstride;
          lVar17 = 0;
          piVar16 = piVar7;
          do {
            lVar13 = (long)*piVar16;
            iVar21 = (int)(short)piVar16[lVar10 + lVar11];
            iVar19 = (int)*(short *)((long)piVar16 + lVar1 + 2);
            *(short *)((long)pvVar12 + lVar17) =
                 (short)((uint)src[lVar13 + (long)iVar6 + 3] * iVar19 +
                         (uint)src[lVar13 + iVar6] * iVar21 >> 4);
            *(short *)((long)pvVar12 + lVar17 + 2) =
                 (short)((uint)src[lVar13 + (long)iVar6 + 4] * iVar19 +
                         (uint)src[lVar13 + (long)iVar6 + 1] * iVar21 >> 4);
            *(short *)((long)pvVar12 + lVar17 + 4) =
                 (short)((uint)src[lVar13 + (long)iVar6 + 5] * iVar19 +
                         (uint)src[lVar13 + (long)iVar6 + 2] * iVar21 >> 4);
            *(short *)((long)pvVar15 + lVar17) =
                 (short)((uint)src[lVar13 + (long)iVar18 + 3] * iVar19 +
                         (uint)src[lVar13 + iVar18] * iVar21 >> 4);
            *(short *)((long)pvVar15 + lVar17 + 2) =
                 (short)((uint)src[lVar13 + (long)iVar18 + 4] * iVar19 +
                         (uint)src[lVar13 + (long)iVar18 + 1] * iVar21 >> 4);
            *(short *)((long)pvVar15 + lVar17 + 4) =
                 (short)((uint)src[lVar13 + (long)iVar18 + 5] * iVar19 +
                         (uint)src[lVar13 + (long)iVar18 + 2] * iVar21 >> 4);
            piVar16 = piVar16 + 1;
            lVar17 = lVar17 + 6;
          } while (lVar3 != lVar17);
        }
      }
      if (w != 0) {
        sVar2 = *(short *)((long)piVar22 + 2);
        iVar6 = *piVar22;
        lVar17 = 0;
        do {
          dst[lVar17] = (uchar)(((uint)((int)*(short *)((long)pvVar14 + lVar17 * 2) *
                                       (int)(short)iVar6) >> 0x10) +
                                ((uint)((int)*(short *)((long)pvVar9 + lVar17 * 2) * (int)sVar2) >>
                                0x10) + 2 >> 2);
          lVar17 = lVar17 + 1;
        } while (w * 3 != (int)lVar17);
      }
      piVar22 = piVar22 + 1;
      uVar20 = uVar20 + 1;
      dst = dst + stride;
      pvVar12 = pvVar14;
      pvVar15 = pvVar9;
      iVar6 = iVar5;
    } while (uVar20 != (uint)h);
  }
  operator_delete__(piVar7);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (local_88 != (void *)0x0 && *piVar8 == 0) {
      free(local_88);
    }
  }
  if (local_58 != (int *)0x0) {
    LOCK();
    *local_58 = *local_58 + -1;
    UNLOCK();
    if (local_b8 != (void *)0x0 && *local_58 == 0) {
      free(local_b8);
    }
  }
  return;
}

Assistant:

void resize_bilinear_c3(const unsigned char* src, int srcw, int srch, int srcstride, unsigned char* dst, int w, int h, int stride)
{
    const int INTER_RESIZE_COEF_BITS=11;
    const int INTER_RESIZE_COEF_SCALE=1 << INTER_RESIZE_COEF_BITS;
//     const int ONE=INTER_RESIZE_COEF_SCALE;

    double scale_x = (double)srcw / w;
    double scale_y = (double)srch / h;

    int* buf = new int[w + h + w + h];

    int* xofs = buf;//new int[w];
    int* yofs = buf + w;//new int[h];

    short* ialpha = (short*)(buf + w + h);//new short[w * 2];
    short* ibeta = (short*)(buf + w + h + w);//new short[h * 2];

    float fx;
    float fy;
    int sx;
    int sy;

#define SATURATE_CAST_SHORT(X) (short)::std::min(::std::max((int)(X + (X >= 0.f ? 0.5f : -0.5f)), SHRT_MIN), SHRT_MAX);

    for (int dx = 0; dx < w; dx++)
    {
        fx = (float)((dx + 0.5) * scale_x - 0.5);
        sx = static_cast<int>(floor(fx));
        fx -= sx;

        if (sx < 0)
        {
            sx = 0;
            fx = 0.f;
        }
        if (sx >= srcw - 1)
        {
            sx = srcw - 2;
            fx = 1.f;
        }

        xofs[dx] = sx*3;

        float a0 = (1.f - fx) * INTER_RESIZE_COEF_SCALE;
        float a1 =        fx  * INTER_RESIZE_COEF_SCALE;

        ialpha[dx*2    ] = SATURATE_CAST_SHORT(a0);
        ialpha[dx*2 + 1] = SATURATE_CAST_SHORT(a1);
    }

    for (int dy = 0; dy < h; dy++)
    {
        fy = (float)((dy + 0.5) * scale_y - 0.5);
        sy = static_cast<int>(floor(fy));
        fy -= sy;

        if (sy < 0)
        {
            sy = 0;
            fy = 0.f;
        }
        if (sy >= srch - 1)
        {
            sy = srch - 2;
            fy = 1.f;
        }

        yofs[dy] = sy;

        float b0 = (1.f - fy) * INTER_RESIZE_COEF_SCALE;
        float b1 =        fy  * INTER_RESIZE_COEF_SCALE;

        ibeta[dy*2    ] = SATURATE_CAST_SHORT(b0);
        ibeta[dy*2 + 1] = SATURATE_CAST_SHORT(b1);
    }

#undef SATURATE_CAST_SHORT

    // loop body
    Mat rowsbuf0(w*3+1, (size_t)2u);
    Mat rowsbuf1(w*3+1, (size_t)2u);
    short* rows0 = (short*)rowsbuf0.data;
    short* rows1 = (short*)rowsbuf1.data;

    int prev_sy1 = -2;

    for (int dy = 0; dy < h; dy++ )
    {
        int sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            short* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const unsigned char *S1 = src + srcstride * (sy+1);

            const short* ialphap = ialpha;
            short* rows1p = rows1;
            for ( int dx = 0; dx < w; dx++ )
            {
                int sx = xofs[dx];
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                const unsigned char* S1p = S1 + sx;
#if __ARM_NEON
                int16x4_t _a0 = vdup_n_s16(a0);
                int16x4_t _a1 = vdup_n_s16(a1);
                uint8x8_t _S1 = uint8x8_t();

                _S1 = vld1_lane_u8(S1p, _S1, 0);
                _S1 = vld1_lane_u8(S1p+1, _S1, 1);
                _S1 = vld1_lane_u8(S1p+2, _S1, 2);
                _S1 = vld1_lane_u8(S1p+3, _S1, 3);
                _S1 = vld1_lane_u8(S1p+4, _S1, 4);
                _S1 = vld1_lane_u8(S1p+5, _S1, 5);

                int16x8_t _S116 = vreinterpretq_s16_u16(vmovl_u8(_S1));
                int16x4_t _S1low = vget_low_s16(_S116);
                int16x4_t _S1high = vext_s16(_S1low, vget_high_s16(_S116), 3);
                int32x4_t _rows1 = vmull_s16(_S1low, _a0);
                _rows1 = vmlal_s16(_rows1, _S1high, _a1);
                int16x4_t _rows1_sr4 = vshrn_n_s32(_rows1, 4);
                vst1_s16(rows1p, _rows1_sr4);
#else
                rows1p[0] = (S1p[0]*a0 + S1p[3]*a1) >> 4;
                rows1p[1] = (S1p[1]*a0 + S1p[4]*a1) >> 4;
                rows1p[2] = (S1p[2]*a0 + S1p[5]*a1) >> 4;
#endif // __ARM_NEON

                ialphap += 2;
                rows1p += 3;
            }
        }
        else
        {
            // hresize two rows
            const unsigned char *S0 = src + srcstride * (sy);
            const unsigned char *S1 = src + srcstride * (sy+1);

            const short* ialphap = ialpha;
            short* rows0p = rows0;
            short* rows1p = rows1;
            for ( int dx = 0; dx < w; dx++ )
            {
                int sx = xofs[dx];
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                const unsigned char* S0p = S0 + sx;
                const unsigned char* S1p = S1 + sx;
#if __ARM_NEON
                int16x4_t _a0 = vdup_n_s16(a0);
                int16x4_t _a1 = vdup_n_s16(a1);
                uint8x8_t _S0 = uint8x8_t();
                uint8x8_t _S1 = uint8x8_t();

                _S0 = vld1_lane_u8(S0p, _S0, 0);
                _S0 = vld1_lane_u8(S0p+1, _S0, 1);
                _S0 = vld1_lane_u8(S0p+2, _S0, 2);
                _S0 = vld1_lane_u8(S0p+3, _S0, 3);
                _S0 = vld1_lane_u8(S0p+4, _S0, 4);
                _S0 = vld1_lane_u8(S0p+5, _S0, 5);

                _S1 = vld1_lane_u8(S1p, _S1, 0);
                _S1 = vld1_lane_u8(S1p+1, _S1, 1);
                _S1 = vld1_lane_u8(S1p+2, _S1, 2);
                _S1 = vld1_lane_u8(S1p+3, _S1, 3);
                _S1 = vld1_lane_u8(S1p+4, _S1, 4);
                _S1 = vld1_lane_u8(S1p+5, _S1, 5);

                int16x8_t _S016 = vreinterpretq_s16_u16(vmovl_u8(_S0));
                int16x8_t _S116 = vreinterpretq_s16_u16(vmovl_u8(_S1));
                int16x4_t _S0low = vget_low_s16(_S016);
                int16x4_t _S1low = vget_low_s16(_S116);
                int16x4_t _S0high = vext_s16(_S0low, vget_high_s16(_S016), 3);
                int16x4_t _S1high = vext_s16(_S1low, vget_high_s16(_S116), 3);
                int32x4_t _rows0 = vmull_s16(_S0low, _a0);
                int32x4_t _rows1 = vmull_s16(_S1low, _a0);
                _rows0 = vmlal_s16(_rows0, _S0high, _a1);
                _rows1 = vmlal_s16(_rows1, _S1high, _a1);
                int16x4_t _rows0_sr4 = vshrn_n_s32(_rows0, 4);
                int16x4_t _rows1_sr4 = vshrn_n_s32(_rows1, 4);
                vst1_s16(rows0p, _rows0_sr4);
                vst1_s16(rows1p, _rows1_sr4);
#else
                rows0p[0] = (S0p[0]*a0 + S0p[3]*a1) >> 4;
                rows0p[1] = (S0p[1]*a0 + S0p[4]*a1) >> 4;
                rows0p[2] = (S0p[2]*a0 + S0p[5]*a1) >> 4;
                rows1p[0] = (S1p[0]*a0 + S1p[3]*a1) >> 4;
                rows1p[1] = (S1p[1]*a0 + S1p[4]*a1) >> 4;
                rows1p[2] = (S1p[2]*a0 + S1p[5]*a1) >> 4;
#endif // __ARM_NEON

                ialphap += 2;
                rows0p += 3;
                rows1p += 3;
            }
        }

        prev_sy1 = sy;

        // vresize
        short b0 = ibeta[0];
        short b1 = ibeta[1];

        short* rows0p = rows0;
        short* rows1p = rows1;
        unsigned char* Dp = dst + stride * (dy);

#if __ARM_NEON
        int nn = (w * 3) >> 3;
#else
        int nn = 0;
#endif
        int remain = (w * 3) - (nn << 3);

#if __ARM_NEON
#if __aarch64__
        int16x4_t _b0 = vdup_n_s16(b0);
        int16x4_t _b1 = vdup_n_s16(b1);
        int32x4_t _v2 = vdupq_n_s32(2);
        for (; nn>0; nn--)
        {
            int16x4_t _rows0p_sr4 = vld1_s16(rows0p);
            int16x4_t _rows1p_sr4 = vld1_s16(rows1p);
            int16x4_t _rows0p_1_sr4 = vld1_s16(rows0p+4);
            int16x4_t _rows1p_1_sr4 = vld1_s16(rows1p+4);

            int32x4_t _rows0p_sr4_mb0 = vmull_s16(_rows0p_sr4, _b0);
            int32x4_t _rows1p_sr4_mb1 = vmull_s16(_rows1p_sr4, _b1);
            int32x4_t _rows0p_1_sr4_mb0 = vmull_s16(_rows0p_1_sr4, _b0);
            int32x4_t _rows1p_1_sr4_mb1 = vmull_s16(_rows1p_1_sr4, _b1);

            int32x4_t _acc = _v2;
            _acc = vsraq_n_s32(_acc, _rows0p_sr4_mb0, 16);
            _acc = vsraq_n_s32(_acc, _rows1p_sr4_mb1, 16);

            int32x4_t _acc_1 = _v2;
            _acc_1 = vsraq_n_s32(_acc_1, _rows0p_1_sr4_mb0, 16);
            _acc_1 = vsraq_n_s32(_acc_1, _rows1p_1_sr4_mb1, 16);

            int16x4_t _acc16 = vshrn_n_s32(_acc, 2);
            int16x4_t _acc16_1 = vshrn_n_s32(_acc_1, 2);

            uint8x8_t _D = vqmovun_s16(vcombine_s16(_acc16, _acc16_1));

            vst1_u8(Dp, _D);

            Dp += 8;
            rows0p += 8;
            rows1p += 8;
        }
#else
        if (nn > 0)
        {
        asm volatile(
            "vdup.s16   d16, %8         \n"
            "mov        r4, #2          \n"
            "vdup.s16   d17, %9         \n"
            "vdup.s32   q12, r4         \n"
            "pld        [%0, #128]      \n"
            "vld1.s16   {d2-d3}, [%0 :128]!\n"
            "pld        [%1, #128]      \n"
            "vld1.s16   {d6-d7}, [%1 :128]!\n"
            "0:                         \n"
            "vmull.s16  q0, d2, d16     \n"
            "vmull.s16  q1, d3, d16     \n"
            "vorr.s32   q10, q12, q12   \n"
            "vorr.s32   q11, q12, q12   \n"
            "vmull.s16  q2, d6, d17     \n"
            "vmull.s16  q3, d7, d17     \n"
            "vsra.s32   q10, q0, #16    \n"
            "vsra.s32   q11, q1, #16    \n"
            "pld        [%0, #128]      \n"
            "vld1.s16   {d2-d3}, [%0 :128]!\n"
            "vsra.s32   q10, q2, #16    \n"
            "vsra.s32   q11, q3, #16    \n"
            "pld        [%1, #128]      \n"
            "vld1.s16   {d6-d7}, [%1 :128]!\n"
            "vshrn.s32  d20, q10, #2    \n"
            "vshrn.s32  d21, q11, #2    \n"
            "vqmovun.s16 d20, q10        \n"
            "vst1.8     {d20}, [%2]!    \n"
            "subs       %3, #1          \n"
            "bne        0b              \n"
            "sub        %0, #16         \n"
            "sub        %1, #16         \n"
            : "=r"(rows0p), // %0
              "=r"(rows1p), // %1
              "=r"(Dp),     // %2
              "=r"(nn)      // %3
            : "0"(rows0p),
              "1"(rows1p),
              "2"(Dp),
              "3"(nn),
              "r"(b0),      // %8
              "r"(b1)       // %9
            : "cc", "memory", "r4", "q0", "q1", "q2", "q3", "q8", "q9", "q10", "q11", "q12"
        );
        }
#endif // __aarch64__
#endif // __ARM_NEON
        for ( ; remain; --remain )
        {
//             D[x] = (rows0[x]*b0 + rows1[x]*b1) >> INTER_RESIZE_COEF_BITS;
            *Dp++ = (unsigned char)(( (short)((b0 * (short)(*rows0p++)) >> 16) + (short)((b1 * (short)(*rows1p++)) >> 16) + 2)>>2);
        }

        ibeta += 2;
    }

    delete[] buf;
}